

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> * parseCommaSeparatedList<float>(string *str)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  string *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  string cur;
  vector<float,_std::allocator<float>_> *parsed;
  stringstream stream;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 uVar4;
  byte bVar5;
  string local_1c0 [40];
  stringstream local_198 [392];
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,in_RSI,_Var2);
  uVar4 = 0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x74ebe7);
  std::__cxx11::string::string(local_1c0);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_198,local_1c0,',');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    Lib::StringUtils::parse<float>((string *)CONCAT17(uVar4,in_stack_fffffffffffffe20));
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)CONCAT17(uVar4,in_stack_fffffffffffffe20),
               (value_type_conflict4 *)in_stack_fffffffffffffe18);
  }
  bVar5 = 1;
  std::__cxx11::string::~string(local_1c0);
  if ((bVar5 & 1) == 0) {
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe18);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::vector<A> parseCommaSeparatedList(std::string const& str)
{
  std::stringstream stream(str);
  std::vector<A> parsed;
  std::string cur;
  while (std::getline(stream, cur, ',')) {
    parsed.push_back(StringUtils::parse<A>(cur));
  }
  return parsed;
}